

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

uint * eastl::lower_bound<unsigned_int_const*,unsigned_int>(uint *first,uint *last,uint *value)

{
  uint *n;
  DifferenceType d2;
  uint *i;
  DifferenceType d;
  uint *value_local;
  uint *last_local;
  uint *first_local;
  
  d = (DifferenceType)value;
  value_local = last;
  last_local = first;
  n = (uint *)distance<unsigned_int_const*>(first,last);
  while (i = n, 0 < (long)i) {
    d2 = (DifferenceType)last_local;
    n = (uint *)((long)i >> 1);
    advance<unsigned_int_const*,long>((uint **)&d2,(long)n);
    if (*(uint *)d2 < *(uint *)d) {
      last_local = (uint *)(d2 + 4);
      n = (uint *)((long)i - ((long)n + 1));
    }
  }
  return last_local;
}

Assistant:

ForwardIterator
    lower_bound(ForwardIterator first, ForwardIterator last, const T& value)
    {
        typedef typename eastl::iterator_traits<ForwardIterator>::difference_type DifferenceType;

        DifferenceType d = eastl::distance(first, last); // This will be efficient for a random access iterator such as an array.

        while(d > 0)
        {
            ForwardIterator i  = first;
            DifferenceType  d2 = d >> 1; // We use '>>1' here instead of '/2' because MSVC++ for some reason generates significantly worse code for '/2'. Go figure.

            eastl::advance(i, d2); // This will be efficient for a random access iterator such as an array.

            if(*i < value)
            {
                // Disabled because std::lower_bound doesn't specify (23.3.3.3, p3) this can be done: EASTL_VALIDATE_COMPARE(!(value < *i)); // Validate that the compare function is sane.
                first = ++i;
                d    -= d2 + 1;
            }
            else
                d = d2;
        }
        return first;
    }